

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

bool __thiscall Assembler::checkIfLdStr(Assembler *this,string *line)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined8 *puVar5;
  Assembler *this_00;
  string operand;
  string instruction;
  smatch regop;
  string_type local_258;
  string_type local_238;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_218;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string_type local_70;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  local_218.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218._M_begin._M_current = (char *)0x0;
  local_218.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s._M_current = (line->_M_dataplus)._M_p;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + line->_M_string_length),&local_218,
                     &twoOperandInstructionOneRegisterOtherAnyAddrMode_abi_cxx11_,0);
  if (bVar1) {
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_238,&local_218,1);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_258,&local_218,2);
    iVar4 = std::__cxx11::string::compare((char *)&local_258);
    if (iVar4 == 0) {
      iVar4 = 0x80;
    }
    else {
      std::__cxx11::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::str(&local_70,&local_218,2);
      this_00 = (Assembler *)&stack0xffffffffffffffb0;
      std::__cxx11::string::substr((ulong)this_00,(ulong)&local_70);
      iVar4 = literalToDecimal(this_00,(string *)&stack0xffffffffffffffb0);
      if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
        operator_delete(local_50._M_p,local_40 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      iVar4 = iVar4 << 4;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::str(&local_258,&local_218,3);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_238._M_dataplus._M_p,
               local_238._M_dataplus._M_p + local_238._M_string_length);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_258._M_dataplus._M_p,
               local_258._M_dataplus._M_p + local_258._M_string_length);
    bVar2 = checkIfLdStrRegDir(this,&local_90,iVar4,&local_b0);
    bVar3 = true;
    if (!bVar2) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_238._M_dataplus._M_p,
                 local_238._M_dataplus._M_p + local_238._M_string_length);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_258._M_dataplus._M_p,
                 local_258._M_dataplus._M_p + local_258._M_string_length);
      bVar2 = checkIfLdStrAbsolute(this,&local_d0,iVar4,&local_f0);
      bVar3 = true;
      if (!bVar2) {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_238._M_dataplus._M_p,
                   local_238._M_dataplus._M_p + local_238._M_string_length);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,local_258._M_dataplus._M_p,
                   local_258._M_dataplus._M_p + local_258._M_string_length);
        bVar2 = checkIfLdStrMemDir(this,&local_110,iVar4,&local_130);
        bVar3 = true;
        if (!bVar2) {
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_150,local_238._M_dataplus._M_p,
                     local_238._M_dataplus._M_p + local_238._M_string_length);
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_170,local_258._M_dataplus._M_p,
                     local_258._M_dataplus._M_p + local_258._M_string_length);
          bVar2 = checkIfLdStrPcRel(this,&local_150,iVar4,&local_170);
          bVar3 = true;
          if (!bVar2) {
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_190,local_238._M_dataplus._M_p,
                       local_238._M_dataplus._M_p + local_238._M_string_length);
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_258._M_dataplus._M_p,
                       local_258._M_dataplus._M_p + local_258._M_string_length);
            bVar2 = checkIfLdStrRegInd(this,&local_190,iVar4,&local_1b0);
            bVar3 = true;
            if (!bVar2) {
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d0,local_238._M_dataplus._M_p,
                         local_238._M_dataplus._M_p + local_238._M_string_length);
              local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f0,local_258._M_dataplus._M_p,
                         local_258._M_dataplus._M_p + local_258._M_string_length);
              bVar3 = checkIfLdStrRegIndDis(this,&local_1d0,iVar4,&local_1f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
                operator_delete(local_1f0._M_dataplus._M_p,
                                local_1f0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
                operator_delete(local_1d0._M_dataplus._M_p,
                                local_1d0.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
              operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (bVar3 == false) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__exception_00130ac8;
      __cxa_throw(puVar5,&AddressingError::typeinfo,std::exception::~exception);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_218.
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_218.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_218.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Assembler::checkIfLdStr(string line) {
    smatch regop;
    if (regex_match(line, regop, twoOperandInstructionOneRegisterOtherAnyAddrMode)) {
        string instruction = regop.str(1);
        int regD = (regop.str(2) == "psw") ? 8 : literalToDecimal(regop.str(2).substr(1));
        regD <<= 4;
        string operand = regop.str(3);
        if (checkIfLdStrRegDir(instruction, regD, operand) || checkIfLdStrAbsolute(instruction, regD, operand) ||
            checkIfLdStrMemDir(instruction, regD, operand) ||
            checkIfLdStrPcRel(instruction, regD, operand) ||
            checkIfLdStrRegInd(instruction, regD, operand) ||
            checkIfLdStrRegIndDis(instruction, regD, operand))
            return true;
        else throw AddressingError();
    }
    return false;
}